

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

char * fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>
                 (char *begin,char *end,format_handler<char> *handler)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  id_adapter adapter;
  id_adapter local_70;
  default_arg_formatter<char> local_60;
  format_arg local_58;
  
  pcVar1 = begin + 1;
  if (pcVar1 == end) {
    report_error("invalid format string");
  }
  cVar2 = *pcVar1;
  if (cVar2 == ':') {
    iVar3 = (handler->parse_ctx).next_arg_id_;
    if (iVar3 < 0) goto LAB_001e524e;
    (handler->parse_ctx).next_arg_id_ = iVar3 + 1;
  }
  else {
    if (cVar2 == '{') {
      copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                (pcVar1,begin + 2,(handler->ctx).out_.container);
      return begin + 2;
    }
    if (cVar2 == '}') {
      iVar3 = (handler->parse_ctx).next_arg_id_;
      if (-1 < iVar3) {
        (handler->parse_ctx).next_arg_id_ = iVar3 + 1;
        basic_format_args<fmt::v11::context>::get(&local_58,&(handler->ctx).args_,iVar3);
        local_70.handler = (format_handler<char> *)(handler->ctx).out_.container;
        basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::default_arg_formatter<char>>
                  (&local_58,(default_arg_formatter<char> *)&local_70);
        return begin + 2;
      }
LAB_001e524e:
      report_error("cannot switch from manual to automatic argument indexing");
    }
    local_70.arg_id = 0;
    local_70.handler = handler;
    pcVar1 = parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                       (pcVar1,end,&local_70);
    iVar3 = local_70.arg_id;
    if (pcVar1 == end) {
      cVar2 = '\0';
    }
    else {
      cVar2 = *pcVar1;
    }
    if (cVar2 == '}') {
      basic_format_args<fmt::v11::context>::get(&local_58,&(handler->ctx).args_,local_70.arg_id);
      local_60.out.container = (basic_appender<char>)(handler->ctx).out_.container;
      basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::default_arg_formatter<char>>
                (&local_58,&local_60);
      begin = pcVar1 + 1;
    }
    else if (cVar2 != ':') {
      report_error("missing \'}\' in format string");
    }
    if (cVar2 == '}') {
      return begin;
    }
  }
  pcVar1 = format_handler<char>::on_format_specs(handler,iVar3,pcVar1 + 1,end);
  if ((pcVar1 != end) && (*pcVar1 == '}')) {
    return pcVar1 + 1;
  }
  report_error("unknown format specifier");
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto parse_replacement_field(const Char* begin,
                                                      const Char* end,
                                                      Handler&& handler)
    -> const Char* {
  ++begin;
  if (begin == end) {
    handler.on_error("invalid format string");
    return end;
  }
  int arg_id = 0;
  switch (*begin) {
  case '}':
    handler.on_replacement_field(handler.on_arg_id(), begin);
    return begin + 1;
  case '{': handler.on_text(begin, begin + 1); return begin + 1;
  case ':': arg_id = handler.on_arg_id(); break;
  default:  {
    struct id_adapter {
      Handler& handler;
      int arg_id;

      FMT_CONSTEXPR void on_index(int id) { arg_id = handler.on_arg_id(id); }
      FMT_CONSTEXPR void on_name(basic_string_view<Char> id) {
        arg_id = handler.on_arg_id(id);
      }
    } adapter = {handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    arg_id = adapter.arg_id;
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(arg_id, begin);
      return begin + 1;
    }
    if (c != ':') {
      handler.on_error("missing '}' in format string");
      return end;
    }
    break;
  }
  }
  begin = handler.on_format_specs(arg_id, begin + 1, end);
  if (begin == end || *begin != '}')
    return handler.on_error("unknown format specifier"), end;
  return begin + 1;
}